

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSample.hpp
# Opt level: O3

DreamPDF *
TasDREAM::posterior<(TasDREAM::TypeSamplingForm)1>
          (DreamPDF *__return_storage_ptr__,DreamModel *model,DreamLikelihood *likelihood,
          DreamPrior *prior)

{
  _Any_data local_80;
  code *local_70;
  _Any_data local_60;
  code *local_50;
  _Any_data local_40;
  code *local_30;
  
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)&local_80,model);
  std::
  function<void_(TasDREAM::TypeSamplingForm,_const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function((function<void_(TasDREAM::TypeSamplingForm,_const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)&local_60,likelihood);
  std::
  function<void_(TasDREAM::TypeSamplingForm,_const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function((function<void_(TasDREAM::TypeSamplingForm,_const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)&local_40,prior);
  std::
  function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
  ::
  function<TasDREAM::posterior<(TasDREAM::TypeSamplingForm)1>(std::function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>,std::function<void(TasDREAM::TypeSamplingForm,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>,std::function<void(TasDREAM::TypeSamplingForm,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>)::_lambda(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)_1_,void>
            ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
              *)__return_storage_ptr__,(anon_class_96_3_eb0ebe5f *)&local_80);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

DreamPDF posterior(DreamModel model,
          DreamLikelihood likelihood,
          DreamPrior prior){
    return [=](const std::vector<double> &candidates, std::vector<double> &values)->void{
        std::vector<double> model_outs;
        model(candidates, model_outs);
        likelihood(form, model_outs, values);

        std::vector<double> prior_vals(values.size());
        prior(form, candidates, prior_vals);

        auto iv = values.begin();
        if (form == regform){
            for(auto p : prior_vals) *iv++ *= p;
        }else{
            for(auto p : prior_vals) *iv++ += p;
        }
    };
}